

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# union_map_union.hh
# Opt level: O0

void avro::codec_traits<umu::_union_map_union_Union__0__>::encode
               (Encoder *e,_union_map_union_Union__0__ *v)

{
  size_t sVar1;
  _union_map_union_Union__0__ *in_RSI;
  Encoder *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff88;
  string local_30 [24];
  _union_map_union_Union__0__ *in_stack_ffffffffffffffe8;
  
  sVar1 = umu::_union_map_union_Union__0__::idx(in_RSI);
  (**(code **)(*(long *)in_RDI + 0xa0))(in_RDI,sVar1);
  sVar1 = umu::_union_map_union_Union__0__::idx(in_RSI);
  if (sVar1 == 0) {
    umu::_union_map_union_Union__0__::get_string_abi_cxx11_(in_stack_ffffffffffffffe8);
    encode<std::__cxx11::string>(in_RDI,in_stack_ffffffffffffff88);
    std::__cxx11::string::~string(local_30);
  }
  else if (sVar1 == 1) {
    (**(code **)(*(long *)in_RDI + 0x20))();
  }
  return;
}

Assistant:

static void encode(Encoder& e, umu::_union_map_union_Union__0__ v) {
        e.encodeUnionIndex(v.idx());
        switch (v.idx()) {
        case 0:
            avro::encode(e, v.get_string());
            break;
        case 1:
            e.encodeNull();
            break;
        }
    }